

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall cs::instance_type::dump_ast(instance_type *this,ostream *stream)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  _Map_pointer pppsVar3;
  _Elt_pointer ppsVar4;
  statement_base **ptr;
  _Elt_pointer ppsVar5;
  any local_30;
  
  poVar2 = std::operator<<(stream,"< Covariant Script AST Dump >\n< BeginMetaData >\n< Version: ");
  poVar2 = std::operator<<(poVar2,(string *)(current_process + 8));
  poVar2 = std::operator<<(poVar2," >\n< Standard Version: ");
  cs_impl::any::any<cs::numeric>(&local_30,(numeric *)(current_process + 0x30));
  poVar2 = operator<<(poVar2,&local_30);
  poVar2 = std::operator<<(poVar2," >\n< Import Path: \"");
  poVar2 = std::operator<<(poVar2,(string *)(current_process + 0x58));
  std::operator<<(poVar2,"\" >\n");
  cs_impl::any::recycle(&local_30);
  std::operator<<(stream,"< Platform: Unix >\n");
  std::operator<<(stream,"< EndMetaData >\n");
  ppsVar5 = (this->statements).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar4 = (this->statements).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar3 = (this->statements).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar1 = (this->statements).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar5 != ppsVar1) {
    (*(*ppsVar5)->_vptr_statement_base[5])(*ppsVar5,stream);
    ppsVar5 = ppsVar5 + 1;
    if (ppsVar5 == ppsVar4) {
      ppsVar5 = pppsVar3[1];
      pppsVar3 = pppsVar3 + 1;
      ppsVar4 = ppsVar5 + 0x40;
    }
  }
  std::ostream::flush();
  return;
}

Assistant:

void instance_type::dump_ast(std::ostream &stream)
	{
		stream << "< Covariant Script AST Dump >\n< BeginMetaData >\n< Version: " << current_process->version
		       << " >\n< Standard Version: "
		       << current_process->std_version
		       << " >\n< Import Path: \""
		       << current_process->import_path
		       << "\" >\n";
#ifdef COVSCRIPT_PLATFORM_WIN32
		stream << "< Platform: Win32 >\n";
#else
		stream << "< Platform: Unix >\n";
#endif
		stream << "< EndMetaData >\n";
		for (auto &ptr: statements)
			ptr->dump(stream);
		stream << std::flush;
	}